

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-sve.c
# Opt level: O0

_Bool trans_FTSSEL(DisasContext_conflict1 *s,arg_rrr_esz *a)

{
  TCGContext_conflict1 *tcg_ctx_00;
  _Bool _Var1;
  uint32_t oprsz;
  uint32_t dofs;
  uint32_t aofs;
  uint32_t bofs;
  uint vsz;
  TCGContext_conflict1 *tcg_ctx;
  arg_rrr_esz *a_local;
  DisasContext_conflict1 *s_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  if (a->esz == 0) {
    s_local._7_1_ = false;
  }
  else {
    _Var1 = sve_access_check_aarch64(s);
    if (_Var1) {
      oprsz = vec_full_reg_size(s);
      dofs = vec_full_reg_offset(s,a->rd);
      aofs = vec_full_reg_offset(s,a->rn);
      bofs = vec_full_reg_offset(s,a->rm);
      tcg_gen_gvec_3_ool_aarch64
                (tcg_ctx_00,dofs,aofs,bofs,oprsz,oprsz,0,
                 (gen_helper_gvec_3_conflict1 *)trans_FTSSEL::fns[a->esz]);
    }
    s_local._7_1_ = true;
  }
  return s_local._7_1_;
}

Assistant:

static bool trans_FTSSEL(DisasContext *s, arg_rrr_esz *a)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    static gen_helper_gvec_3 * const fns[4] = {
        NULL,
        gen_helper_sve_ftssel_h,
        gen_helper_sve_ftssel_s,
        gen_helper_sve_ftssel_d,
    };
    if (a->esz == 0) {
        return false;
    }
    if (sve_access_check(s)) {
        unsigned vsz = vec_full_reg_size(s);
        tcg_gen_gvec_3_ool(tcg_ctx, vec_full_reg_offset(s, a->rd),
                           vec_full_reg_offset(s, a->rn),
                           vec_full_reg_offset(s, a->rm),
                           vsz, vsz, 0, fns[a->esz]);
    }
    return true;
}